

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O2

void __thiscall UDUNITS_acceptedAlias_Test::TestBody(UDUNITS_acceptedAlias_Test *this)

{
  bool bVar1;
  XMLError XVar2;
  XMLElement *pXVar3;
  char *pcVar4;
  uint64_t uVar5;
  XMLElement *this_00;
  unit uVar6;
  XMLElement *pXVar7;
  ostream *poVar8;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *in_R9;
  precise_unit pVar9;
  unit local_408;
  int failConvert;
  XMLElement *local_3f8;
  double local_3f0;
  string def;
  AssertionResult gtest_ar_;
  string local_398;
  string local_378;
  string local_358;
  XMLDocument doc;
  
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  XVar2 = tinyxml2::XMLDocument::LoadFile
                    (&doc,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  this_01 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = XVar2 == XML_SUCCESS;
  if (XVar2 == XML_SUCCESS) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_01);
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"unit-system");
    local_3f8 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"unit");
    failConvert = 0;
    while (local_3f8 != (XMLElement *)0x0) {
      pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_3f8->super_XMLNode,"def");
      pcVar4 = tinyxml2::XMLNode::Value((pXVar3->super_XMLNode)._firstChild);
      std::__cxx11::string::string((string *)&def,pcVar4,(allocator *)&gtest_ar_);
      std::__cxx11::string::string((string *)&local_398,(string *)&def);
      uVar5 = units::getDefaultFlags();
      pVar9 = units::unit_from_string(&local_398,uVar5);
      local_3f0 = pVar9.multiplier_;
      std::__cxx11::string::~string((string *)&local_398);
      pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_3f8->super_XMLNode,"aliases");
      if (pXVar3 == (XMLElement *)0x0) {
        local_3f8 = tinyxml2::XMLNode::NextSiblingElement(&local_3f8->super_XMLNode,"unit");
      }
      else {
        this_00 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"name");
        uVar6 = (unit)((ulong)(uint)(float)local_3f0 | pVar9._8_8_ << 0x20);
        for (; this_00 != (XMLElement *)0x0;
            this_00 = tinyxml2::XMLNode::NextSiblingElement(&this_00->super_XMLNode,"name")) {
          pXVar7 = tinyxml2::XMLNode::FirstChildElement(&this_00->super_XMLNode,"singular");
          pcVar4 = tinyxml2::XMLNode::Value((pXVar7->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_358,pcVar4,(allocator *)&gtest_ar_);
          uVar5 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_358,uVar5);
          local_3f0 = pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_358);
          if ((pVar9._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(local_3f0)) {
            poVar8 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar8 = std::operator<<(poVar8,pcVar4);
            poVar8 = std::operator<<(poVar8," into a valid unit def=");
            poVar8 = std::operator<<(poVar8,(string *)&def);
            std::operator<<(poVar8,'\n');
LAB_001288be:
            failConvert = failConvert + 1;
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)local_3f0 | pVar9._8_8_ << 0x20;
            local_408 = uVar6;
            bVar1 = units::unit::operator!=((unit *)&gtest_ar_,&local_408);
            if (bVar1) {
              std::__cxx11::string::string((string *)&gtest_ar_,pcVar4,(allocator *)&local_408);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&gtest_ar_,"gal");
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (bVar1) {
                poVar8 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
                poVar8 = std::operator<<(poVar8,pcVar4);
                poVar8 = std::operator<<(poVar8," and ");
                poVar8 = std::operator<<(poVar8,(string *)&def);
                std::operator<<(poVar8,"\n");
                goto LAB_001288be;
              }
            }
          }
        }
        for (pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"symbol");
            pXVar3 != (XMLElement *)0x0;
            pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"symbol")) {
          pcVar4 = tinyxml2::XMLNode::Value((pXVar3->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_378,pcVar4,(allocator *)&gtest_ar_);
          uVar5 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_378,uVar5);
          local_3f0 = pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_378);
          if ((pVar9._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(local_3f0)) {
            poVar8 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar8 = std::operator<<(poVar8,pcVar4);
            poVar8 = std::operator<<(poVar8," into a valid unit def=");
            poVar8 = std::operator<<(poVar8,(string *)&def);
            std::operator<<(poVar8,'\n');
LAB_00128a42:
            failConvert = failConvert + 1;
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)local_3f0 | pVar9._8_8_ << 0x20;
            local_408 = uVar6;
            bVar1 = units::unit::operator!=((unit *)&gtest_ar_,&local_408);
            if (bVar1) {
              std::__cxx11::string::string((string *)&gtest_ar_,pcVar4,(allocator *)&local_408);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&gtest_ar_,"a");
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (bVar1) {
                poVar8 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
                poVar8 = std::operator<<(poVar8,pcVar4);
                poVar8 = std::operator<<(poVar8," and ");
                poVar8 = std::operator<<(poVar8,(string *)&def);
                std::operator<<(poVar8,"\n");
                goto LAB_00128a42;
              }
            }
          }
        }
        local_3f8 = tinyxml2::XMLNode::NextSiblingElement(&local_3f8->super_XMLNode,"unit");
      }
      std::__cxx11::string::~string((string *)&def);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&def,"failConvert","0",&failConvert,(int *)&gtest_ar_);
    if ((char)def._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (def._M_string_length == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)def._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x87,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_408,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&def._M_string_length;
  }
  else {
    testing::Message::Message((Message *)&local_408);
    std::ostream::operator<<((long *)((long)local_408 + 0x10),XVar2);
    std::endl<char,std::char_traits<char>>((ostream *)((long)local_408 + 0x10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&def,(internal *)&gtest_ar_,(AssertionResult *)0x169878,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&failConvert,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x4f,(char *)CONCAT71(def._M_dataplus._M_p._1_7_,(char)def._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&failConvert,(Message *)&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&failConvert);
    std::__cxx11::string::~string((string *)&def);
    if (local_408 != (unit)0x0) {
      (**(code **)(*(long *)local_408 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  tinyxml2::XMLDocument::~XMLDocument(&doc);
  return;
}

Assistant:

TEST(UDUNITS, acceptedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert{0};
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (!alias) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                    if (std::string(sname) != "gal") {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                    if (std::string(symString) != "a") {
                        std::cout << "name and unit do not match " << symString
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}